

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O1

void __thiscall Renderer::UpdateWindowTitle(Renderer *this,int score,int fps)

{
  uint uVar1;
  long *plVar2;
  undefined8 *puVar3;
  uint uVar4;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  string title;
  string __str_1;
  string __str;
  long *local_d0;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  uVar8 = -score;
  if (0 < score) {
    uVar8 = score;
  }
  uVar9 = 1;
  if (9 < uVar8) {
    uVar7 = (ulong)uVar8;
    uVar1 = 4;
    do {
      uVar9 = uVar1;
      uVar4 = (uint)uVar7;
      if (uVar4 < 100) {
        uVar9 = uVar9 - 2;
        goto LAB_0010384f;
      }
      if (uVar4 < 1000) {
        uVar9 = uVar9 - 1;
        goto LAB_0010384f;
      }
      if (uVar4 < 10000) goto LAB_0010384f;
      uVar7 = uVar7 / 10000;
      uVar1 = uVar9 + 4;
    } while (99999 < uVar4);
    uVar9 = uVar9 + 1;
  }
LAB_0010384f:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar9 - (char)(score >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)score >> 0x1f) + (long)local_50[0]),uVar9,uVar8);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x10516e);
  local_70 = &local_60;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar2[3];
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar6 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar6) {
    local_80 = *puVar6;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar6;
    local_90 = (ulong *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)puVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  uVar8 = -fps;
  if (0 < fps) {
    uVar8 = fps;
  }
  uVar9 = 1;
  if (9 < uVar8) {
    uVar7 = (ulong)uVar8;
    uVar1 = 4;
    do {
      uVar9 = uVar1;
      uVar4 = (uint)uVar7;
      if (uVar4 < 100) {
        uVar9 = uVar9 - 2;
        goto LAB_0010399f;
      }
      if (uVar4 < 1000) {
        uVar9 = uVar9 - 1;
        goto LAB_0010399f;
      }
      if (uVar4 < 10000) goto LAB_0010399f;
      uVar7 = uVar7 / 10000;
      uVar1 = uVar9 + 4;
    } while (99999 < uVar4);
    uVar9 = uVar9 + 1;
  }
LAB_0010399f:
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar9 - (char)(fps >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)fps >> 0x1f) + (long)local_b0),uVar9,uVar8);
  uVar7 = 0xf;
  if (local_90 != &local_80) {
    uVar7 = local_80;
  }
  if (uVar7 < (ulong)(local_a8 + local_88)) {
    uVar7 = 0xf;
    if (local_b0 != local_a0) {
      uVar7 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_88) <= uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
      goto LAB_00103a2d;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
LAB_00103a2d:
  local_d0 = &local_c0;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_c0 = *plVar2;
    uStack_b8 = puVar3[3];
  }
  else {
    local_c0 = *plVar2;
    local_d0 = (long *)*puVar3;
  }
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  SDL_SetWindowTitle(this->sdl_window,local_d0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  return;
}

Assistant:

void Renderer::UpdateWindowTitle(int score, int fps) {
  std::string title{"Snake Score: " + std::to_string(score) + " FPS: " + std::to_string(fps)};
  SDL_SetWindowTitle(sdl_window, title.c_str());
}